

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

bool absl::container_internal::ShouldInsertBackwardsForDebug
               (size_t capacity,size_t hash,ctrl_t *ctrl)

{
  ulong *puVar1;
  ulong uVar2;
  long *in_FS_OFFSET;
  
  if (capacity < 0xf) {
    return false;
  }
  puVar1 = (ulong *)(*in_FS_OFFSET - 0x30);
  uVar2 = *puVar1;
  *puVar1 = uVar2 + 1;
  return 6 < (uint)((uVar2 + 1 ^ (ulong)ctrl >> 0xc ^ hash >> 7 ^ (ulong)puVar1) % 0xd);
}

Assistant:

inline bool is_small(size_t capacity) { return capacity < Group::kWidth - 1; }